

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::initRun
          (TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this,_run *run
          ,_tessellation_primitive_mode primitive_mode,GLint n_patch_vertices,bool is_indiced,
          GLint n_instances,uint drawcall_count_multiplier)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  uint uVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *this_00;
  void *__s;
  float afStack_108 [2];
  GLfloat tess_levels [4];
  uint local_ec;
  uint n_index;
  uchar restart_index;
  uint bo_size;
  uchar *bo_contents;
  uint interleave_rate;
  undefined4 uStack_cc;
  GLboolean is_primitive_restart_supported;
  GLint link_status;
  uint n_varyings;
  char *varyings [5];
  GLuint local_98;
  uint n_shader_ids;
  GLuint shader_ids [2];
  char *te_body_raw_ptr;
  string te_body;
  GLchar *local_58;
  char *tc_body_raw_ptr;
  string tc_body;
  Functions *gl;
  GLint n_instances_local;
  bool is_indiced_local;
  GLint n_patch_vertices_local;
  _tessellation_primitive_mode primitive_mode_local;
  _run *run_local;
  TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this_local;
  
  run->drawcall_count_multiplier = drawcall_count_multiplier;
  run->drawcall_is_indiced = is_indiced;
  run->n_instances = n_instances;
  run->n_patch_vertices = n_patch_vertices;
  run->primitive_mode = primitive_mode;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar5->_vptr_RenderContext[3])();
  tc_body.field_2._8_8_ = CONCAT44(extraout_var,iVar1);
  GVar2 = (**(code **)(tc_body.field_2._8_8_ + 0x3c8))();
  run->po_id = GVar2;
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glCreateProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x481);
  getTCCode_abi_cxx11_((string *)&tc_body_raw_ptr,this,n_patch_vertices);
  local_58 = (GLchar *)std::__cxx11::string::c_str();
  GVar2 = (**(code **)(tc_body.field_2._8_8_ + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER);
  run->tc_id = GVar2;
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glCreateShader() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x488);
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,run->tc_id,1,&local_58);
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glShaderSource() failed for tessellation control shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x48b);
  getTECode_abi_cxx11_((string *)&te_body_raw_ptr,this,primitive_mode);
  shader_ids = (GLuint  [2])std::__cxx11::string::c_str();
  GVar2 = (**(code **)(tc_body.field_2._8_8_ + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
  run->te_id = GVar2;
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glCreateShader() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x492);
  TestCaseBase::shaderSourceSpecialized
            (&this->super_TestCaseBase,run->te_id,1,(GLchar **)shader_ids);
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glShaderSource() failed for tessellation evaluation shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x495);
  local_98 = run->tc_id;
  n_shader_ids = run->te_id;
  varyings[4]._4_4_ = 2;
  TessellationShaderUtils::compileShaders(this->m_utils_ptr,2,&local_98,true);
  (**(code **)(tc_body.field_2._8_8_ + 0x10))(run->po_id,this->m_fs_id);
  (**(code **)(tc_body.field_2._8_8_ + 0x10))(run->po_id,run->te_id);
  (**(code **)(tc_body.field_2._8_8_ + 0x10))(run->po_id,this->m_vs_id);
  (**(code **)(tc_body.field_2._8_8_ + 0x10))(run->po_id,run->tc_id);
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glAttachShader() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x4a3);
  varyings[3] = "te_primitive_id";
  varyings[1] = "te_tc_primitive_id";
  varyings[2] = "te_patch_vertices_in";
  link_status = 0x2b26d70;
  n_varyings = 0;
  varyings[0]._0_4_ = 0x2b26d84;
  varyings[0]._4_4_ = 0;
  uStack_cc = 5;
  (**(code **)(tc_body.field_2._8_8_ + 0x14c8))(run->po_id,5,&link_status,0x8c8c);
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glTransformFeedbackVaryings() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x4ab);
  interleave_rate = 0;
  (**(code **)(tc_body.field_2._8_8_ + 0xce8))(run->po_id);
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glLinkProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x4b1);
  (**(code **)(tc_body.field_2._8_8_ + 0x9d8))(run->po_id,0x8b82,&interleave_rate);
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glGetProgramiv() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x4b4);
  if (interleave_rate == 1) {
    if (is_indiced) {
      (**(code **)(tc_body.field_2._8_8_ + 0x6c8))(1,run);
      dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
      glu::checkError(dVar3,"glGenBuffers() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x4c2);
      bo_contents._7_1_ = '\x01';
      (**(code **)(tc_body.field_2._8_8_ + 0x798))(0x8221,(long)&bo_contents + 7);
      dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
      glu::checkError(dVar3,
                      "glGetIntegerv() failed for GL_PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED pname",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x4cc);
      bo_contents._0_4_ = run->n_patch_vertices << 1;
      n_index = run->n_patch_vertices * run->drawcall_count_multiplier;
      if (bo_contents._7_1_ != '\0') {
        run->n_restart_indices = n_index / (uint)bo_contents;
        n_index = run->n_restart_indices + n_index;
      }
      __s = operator_new__((ulong)n_index);
      memset(__s,0,(ulong)n_index);
      if (bo_contents._7_1_ != '\0') {
        for (local_ec = (uint)bo_contents; local_ec < n_index;
            local_ec = (uint)bo_contents + local_ec + 1) {
          *(undefined1 *)((long)__s + (ulong)local_ec) = 0xff;
        }
      }
      (**(code **)(tc_body.field_2._8_8_ + 0x40))(0x8893,run->bo_indices_id);
      dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
      glu::checkError(dVar3,"glBindBuffer() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x4fc);
      (**(code **)(tc_body.field_2._8_8_ + 0x150))(0x8893,n_index,__s,0x88e4);
      dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
      glu::checkError(dVar3,"glBufferData() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x4ff);
      if (__s != (void *)0x0) {
        operator_delete__(__s);
      }
    }
    afStack_108[0] = 4.0;
    afStack_108[1] = 4.0;
    tess_levels[0] = 4.0;
    tess_levels[1] = 4.0;
    uVar4 = TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                      (this->m_utils_ptr,run->primitive_mode,afStack_108,afStack_108,
                       TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,false);
    run->n_result_vertices = uVar4;
    run->n_result_vertices =
         run->drawcall_count_multiplier * run->n_instances * run->n_result_vertices;
    std::__cxx11::string::~string((string *)&te_body_raw_ptr);
    std::__cxx11::string::~string((string *)&tc_body_raw_ptr);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Program linking failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
             ,0x4b8);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::initRun(
	_run& run, _tessellation_primitive_mode primitive_mode, glw::GLint n_patch_vertices, bool is_indiced,
	glw::GLint n_instances, unsigned int drawcall_count_multiplier)
{
	run.drawcall_count_multiplier = drawcall_count_multiplier;
	run.drawcall_is_indiced		  = is_indiced;
	run.n_instances				  = n_instances;
	run.n_patch_vertices		  = n_patch_vertices;
	run.primitive_mode			  = primitive_mode;

	/* Set up a program object for the descriptor */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	run.po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed");

	/* Set up tessellation control shader object */
	std::string tc_body			= getTCCode(n_patch_vertices);
	const char* tc_body_raw_ptr = tc_body.c_str();

	run.tc_id = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed");

	shaderSourceSpecialized(run.tc_id, 1 /* count */, &tc_body_raw_ptr);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for tessellation control shader");

	/* Set up tessellation evaluation shader object. */
	std::string te_body			= getTECode(primitive_mode);
	const char* te_body_raw_ptr = te_body.c_str();

	run.te_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed");

	shaderSourceSpecialized(run.te_id, 1 /* count */, &te_body_raw_ptr);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for tessellation evaluation shader");

	/* Compile the shaders */
	const glw::GLuint  shader_ids[] = { run.tc_id, run.te_id };
	const unsigned int n_shader_ids = sizeof(shader_ids) / sizeof(shader_ids[0]);

	m_utils_ptr->compileShaders(n_shader_ids, shader_ids, true /* should_succeed */);

	/* Attach all shader to the program object */
	gl.attachShader(run.po_id, m_fs_id);
	gl.attachShader(run.po_id, run.te_id);
	gl.attachShader(run.po_id, m_vs_id);
	gl.attachShader(run.po_id, run.tc_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() failed");

	/* Set up XFB */
	const char* varyings[] = { "te_tc_invocation_id", "te_tc_patch_vertices_in", "te_tc_primitive_id",
							   "te_patch_vertices_in", "te_primitive_id" };
	const unsigned int n_varyings = sizeof(varyings) / sizeof(varyings[0]);

	gl.transformFeedbackVaryings(run.po_id, n_varyings, varyings, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() failed");

	/* Link the program object */
	glw::GLint link_status = GL_FALSE;

	gl.linkProgram(run.po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() failed");

	gl.getProgramiv(run.po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() failed");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed");
	}

	/* If this is going to be an indiced draw call, we need to initialize a buffer
	 * object that will hold index data. GL_UNSIGNED_BYTE index type will be always
	 * used for the purpose of this test.
	 */
	if (is_indiced)
	{
		gl.genBuffers(1, &run.bo_indices_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed");

		/* Implementations are allowed NOT to support primitive restarting for patches.
		 * Take this into account and do not insert restart indices, if ES reports no
		 * support.
		 */
		glw::GLboolean is_primitive_restart_supported = GL_TRUE;

		gl.getBooleanv(GL_PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED, &is_primitive_restart_supported);
		GLU_EXPECT_NO_ERROR(gl.getError(),
							"glGetIntegerv() failed for GL_PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED pname");

		/* Set up index buffer storage. Note that we're not using any attributes
		 * in any stage - our goal is just to make sure the primitive counter does
		 * not restart whenever restart index is encountered during a draw call */
		DE_ASSERT(run.n_patch_vertices > 3);
		DE_ASSERT(run.drawcall_count_multiplier > 1);

		const unsigned int interleave_rate = run.n_patch_vertices * 2;
		unsigned char*	 bo_contents	 = DE_NULL;
		unsigned int	   bo_size =
			static_cast<unsigned int>(sizeof(unsigned char) * run.n_patch_vertices * run.drawcall_count_multiplier);

		/* Count in restart indices if necessary */
		if (is_primitive_restart_supported)
		{
			run.n_restart_indices = (bo_size / interleave_rate);
			bo_size += 1 /* restart index */ * run.n_restart_indices;
		}

		/* Allocate space for the index buffer */
		bo_contents = new unsigned char[bo_size];

		/* Interleave the restart index every two complete sets of vertices, each set
		 * making up a full set of vertices. Fill all other indices with zeros. The
		 * indices don't really matter since test shaders do not use any attributes -
		 * what we want to verify is that the restart index does not break the primitive
		 * id counter.
		 *
		 * NOTE: Our interleave rate is just an arbitrary value that makes
		 *       sense, given the multipliers we use for the test */
		const unsigned char restart_index = 0xFF;

		memset(bo_contents, 0, bo_size);

		if (is_primitive_restart_supported)
		{
			for (unsigned int n_index = interleave_rate; n_index < bo_size; n_index += interleave_rate)
			{
				bo_contents[n_index] = restart_index;

				/* Move one index ahead */
				n_index++;
			}
		}

		/* Set up the buffer object storage */
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, run.bo_indices_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed");

		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, bo_size, bo_contents, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed");

		/* Release the buffer */
		delete[] bo_contents;

		bo_contents = NULL;
	}

	/* Retrieve amount of tessellation coordinates.
	 *
	 * Note: this test assumes a constant tessellation level value of 4 for all
	 *       inner/outer tessellation levels */
	const glw::GLfloat tess_levels[] = { 4.0f, 4.0f, 4.0f, 4.0f };

	run.n_result_vertices = m_utils_ptr->getAmountOfVerticesGeneratedByTessellator(
		run.primitive_mode, tess_levels, tess_levels, TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
		false); /* is_point_mode_enabled */

	/* The value we have at this point is for single patch only. To end up
	 * with actual amount of coordinates that will be generated by the tessellator,
	 * we need to multiply it by drawcall_count_multiplier * n_instances */
	run.n_result_vertices *= run.drawcall_count_multiplier * run.n_instances;

	/* We're done! */
}